

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_manual_options_widget_base.h
# Opt level: O1

void __thiscall
Ui_ManualOptionsWidgetBase::setupUi
          (Ui_ManualOptionsWidgetBase *this,QWidget *ManualOptionsWidgetBase)

{
  QGridLayout *this_00;
  QLabel *pQVar1;
  QSlider *pQVar2;
  QLineEdit *pQVar3;
  QSpacerItem *pQVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayData *local_40 [2];
  long local_30;
  
  QObject::objectName();
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  if (local_30 == 0) {
    QVar12.m_data = (storage_type *)0x17;
    QVar12.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar12);
    QObject::setObjectName((QString *)ManualOptionsWidgetBase);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,8);
      }
    }
  }
  local_40[0] = (QArrayData *)&DAT_4c00000188;
  QWidget::resize((QSize *)ManualOptionsWidgetBase);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(ManualOptionsWidgetBase,0));
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ManualOptionsWidgetBase);
  this->gridLayout = this_00;
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_00);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QLayout::setContentsMargins((int)this->gridLayout,4,4,4);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,ManualOptionsWidgetBase,0);
  this->blackPointLabel = pQVar1;
  QVar6.m_data = (storage_type *)0xf;
  QVar6.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->blackPointLabel,0,0,1,1,0);
  pQVar2 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar2,ManualOptionsWidgetBase);
  this->blackPointSlider = pQVar2;
  QVar7.m_data = (storage_type *)0x10;
  QVar7.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QWidget::setMinimumSize((int)this->blackPointSlider,200);
  QAbstractSlider::setOrientation((Orientation)this->blackPointSlider);
  QGridLayout::addWidget(this->gridLayout,this->blackPointSlider,0,1,1,1,0);
  pQVar3 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar3,ManualOptionsWidgetBase);
  this->blackPointEdit = pQVar3;
  QVar8.m_data = (storage_type *)0xe;
  QVar8.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->blackPointEdit,0));
  QWidget::setMinimumSize((int)this->blackPointEdit,100);
  QLineEdit::setReadOnly(SUB81(this->blackPointEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->blackPointEdit,0,2,1,1,0);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,ManualOptionsWidgetBase,0);
  this->whitePointLabel = pQVar1;
  QVar9.m_data = (storage_type *)0xf;
  QVar9.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->whitePointLabel,1,0,1,1,0);
  pQVar2 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar2,ManualOptionsWidgetBase);
  this->whitePointSlider = pQVar2;
  QVar10.m_data = (storage_type *)0x10;
  QVar10.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar2);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QWidget::setMinimumSize((int)this->whitePointSlider,200);
  QAbstractSlider::setOrientation((Orientation)this->whitePointSlider);
  QGridLayout::addWidget(this->gridLayout,this->whitePointSlider,1,1,1,1,0);
  pQVar3 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar3,ManualOptionsWidgetBase);
  this->whitePointEdit = pQVar3;
  QVar11.m_data = (storage_type *)0xe;
  QVar11.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar3);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->whitePointEdit,0));
  QWidget::setMinimumSize((int)this->whitePointEdit,100);
  QLineEdit::setReadOnly(SUB81(this->whitePointEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->whitePointEdit,1,2,1,1,0);
  pQVar4 = (QSpacerItem *)operator_new(0x28);
  *(undefined4 *)(pQVar4 + 8) = 0;
  *(code **)pQVar4 = QImage::scanLine;
  *(undefined4 *)(pQVar4 + 0xc) = 0x13e;
  *(undefined4 *)(pQVar4 + 0x10) = 6;
  *(undefined4 *)(pQVar4 + 0x14) = 0x710000;
  *(undefined4 *)(pQVar4 + 0x18) = 0;
  *(undefined8 *)(pQVar4 + 0x1c) = 0xffffffff00000000;
  *(undefined4 *)(pQVar4 + 0x24) = 0xffffffff;
  this->verticalSpacer = pQVar4;
  QGridLayout::addItem(this->gridLayout,pQVar4,2,0,1,3,0);
  retranslateUi(this,ManualOptionsWidgetBase);
  QMetaObject::connectSlotsByName((QObject *)ManualOptionsWidgetBase);
  return;
}

Assistant:

void setupUi(QWidget *ManualOptionsWidgetBase)
    {
        if (ManualOptionsWidgetBase->objectName().isEmpty())
            ManualOptionsWidgetBase->setObjectName(QString::fromUtf8("ManualOptionsWidgetBase"));
        ManualOptionsWidgetBase->resize(392, 76);
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Maximum);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(ManualOptionsWidgetBase->sizePolicy().hasHeightForWidth());
        ManualOptionsWidgetBase->setSizePolicy(sizePolicy);
        gridLayout = new QGridLayout(ManualOptionsWidgetBase);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        gridLayout->setContentsMargins(4, 4, 4, 4);
        blackPointLabel = new QLabel(ManualOptionsWidgetBase);
        blackPointLabel->setObjectName(QString::fromUtf8("blackPointLabel"));

        gridLayout->addWidget(blackPointLabel, 0, 0, 1, 1);

        blackPointSlider = new QSlider(ManualOptionsWidgetBase);
        blackPointSlider->setObjectName(QString::fromUtf8("blackPointSlider"));
        blackPointSlider->setMinimumSize(QSize(200, 0));
        blackPointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(blackPointSlider, 0, 1, 1, 1);

        blackPointEdit = new QLineEdit(ManualOptionsWidgetBase);
        blackPointEdit->setObjectName(QString::fromUtf8("blackPointEdit"));
        QSizePolicy sizePolicy1(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(blackPointEdit->sizePolicy().hasHeightForWidth());
        blackPointEdit->setSizePolicy(sizePolicy1);
        blackPointEdit->setMinimumSize(QSize(100, 0));
        blackPointEdit->setReadOnly(true);

        gridLayout->addWidget(blackPointEdit, 0, 2, 1, 1);

        whitePointLabel = new QLabel(ManualOptionsWidgetBase);
        whitePointLabel->setObjectName(QString::fromUtf8("whitePointLabel"));

        gridLayout->addWidget(whitePointLabel, 1, 0, 1, 1);

        whitePointSlider = new QSlider(ManualOptionsWidgetBase);
        whitePointSlider->setObjectName(QString::fromUtf8("whitePointSlider"));
        whitePointSlider->setMinimumSize(QSize(200, 0));
        whitePointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(whitePointSlider, 1, 1, 1, 1);

        whitePointEdit = new QLineEdit(ManualOptionsWidgetBase);
        whitePointEdit->setObjectName(QString::fromUtf8("whitePointEdit"));
        sizePolicy1.setHeightForWidth(whitePointEdit->sizePolicy().hasHeightForWidth());
        whitePointEdit->setSizePolicy(sizePolicy1);
        whitePointEdit->setMinimumSize(QSize(100, 0));
        whitePointEdit->setReadOnly(true);

        gridLayout->addWidget(whitePointEdit, 1, 2, 1, 1);

        verticalSpacer = new QSpacerItem(318, 6, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout->addItem(verticalSpacer, 2, 0, 1, 3);


        retranslateUi(ManualOptionsWidgetBase);

        QMetaObject::connectSlotsByName(ManualOptionsWidgetBase);
    }